

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::indicateProgress(QPDFWriter *this,bool decrement,bool finished)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint *puVar5;
  element_type *peVar6;
  int *piVar7;
  uint local_44;
  uint local_40;
  int local_2c [3];
  int local_20;
  int increment;
  uint local_18;
  byte local_12;
  undefined1 local_11;
  int percentage;
  bool finished_local;
  bool decrement_local;
  QPDFWriter *this_local;
  
  local_12 = finished;
  local_11 = decrement;
  _percentage = this;
  if (decrement) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar3->events_seen = peVar3->events_seen + -1;
    return;
  }
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3->events_seen = peVar3->events_seen + 1;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4 = std::__shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(peVar3->progress_reporter).
                       super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar4 == (element_type *)0x0) {
    return;
  }
  if ((local_12 & 1) == 0) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    iVar1 = peVar3->events_seen;
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if (iVar1 < peVar3->next_progress_report) goto LAB_00311816;
  }
  if ((local_12 & 1) == 0) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if (peVar3->next_progress_report == 0) {
      local_44 = 0;
    }
    else {
      increment = 99;
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      iVar1 = peVar3->events_seen;
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_20 = (iVar1 * 100) / peVar3->events_expected + 1;
      puVar5 = (uint *)std::min<int>(&increment,&local_20);
      local_44 = *puVar5;
    }
    local_40 = local_44;
  }
  else {
    local_40 = 100;
  }
  local_18 = local_40;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar6 = std::
           __shared_ptr_access<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->progress_reporter);
  (*peVar6->_vptr_ProgressReporter[2])(peVar6,(ulong)local_18);
LAB_00311816:
  local_2c[1] = 1;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_2c[0] = peVar3->events_expected / 100;
  piVar7 = std::max<int>(local_2c + 1,local_2c);
  local_2c[2] = *piVar7;
  while( true ) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    iVar1 = peVar3->events_seen;
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    iVar2 = local_2c[2];
    if (iVar1 < peVar3->next_progress_report) break;
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar3->next_progress_report = iVar2 + peVar3->next_progress_report;
  }
  return;
}

Assistant:

void
QPDFWriter::indicateProgress(bool decrement, bool finished)
{
    if (decrement) {
        --m->events_seen;
        return;
    }

    ++m->events_seen;

    if (!m->progress_reporter.get()) {
        return;
    }

    if (finished || (m->events_seen >= m->next_progress_report)) {
        int percentage =
            (finished ? 100
                 : m->next_progress_report == 0
                 ? 0
                 : std::min(99, 1 + ((100 * m->events_seen) / m->events_expected)));
        m->progress_reporter->reportProgress(percentage);
    }
    int increment = std::max(1, (m->events_expected / 100));
    while (m->events_seen >= m->next_progress_report) {
        m->next_progress_report += increment;
    }
}